

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryNormalize(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptString *this;
  char16 *pcVar8;
  TempArenaAllocatorObject *tempAllocator;
  CallInfo this_00;
  NormalizationForm normalizationForm;
  int in_stack_00000010;
  charcount_t local_54;
  CallInfo CStack_50;
  charcount_t sizeEstimate;
  CallInfo callInfo_local;
  JavascriptString *pThis;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  CStack_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bbde52;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&pThis,&stack0xffffffffffffffb0,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)CStack_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d6,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bbde52;
    *puVar6 = 0;
  }
  callInfo_local = (CallInfo)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&pThis,pSVar1,L"String.prototype.normalize",
             (JavascriptString **)&callInfo_local);
  normalizationForm = C;
  if (((uint)pThis & 0xfffffe) != 0) {
    BVar4 = JavascriptOperators::IsUndefinedObject(*(Var *)((long)args.super_Arguments.Info + 8));
    if (BVar4 == 0) {
      normalizationForm = D;
      pvVar7 = Arguments::operator[]((Arguments *)&pThis,1);
      bVar3 = VarIs<Js::JavascriptString>(pvVar7);
      if (bVar3) {
        this = UnsafeVarTo<Js::JavascriptString>(pvVar7);
        if (this == (JavascriptString *)0x0) goto LAB_00bbdcd3;
      }
      else {
LAB_00bbdcd3:
        pvVar7 = Arguments::operator[]((Arguments *)&pThis,1);
        this = JavascriptConversion::ToString(pvVar7,pSVar1);
      }
      iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x6b])(this,L"NFD",3);
      if (iVar5 == 0) {
        iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(this,L"NFKC",4);
        normalizationForm = KC;
        if (iVar5 == 0) {
          iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(this,L"NFKD",4)
          ;
          normalizationForm = KD;
          if (iVar5 == 0) {
            iVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
                              (this,L"NFC",3);
            normalizationForm = C;
            if (iVar5 == 0) {
              pcVar8 = GetString(this);
              JavascriptError::ThrowRangeErrorVar(pSVar1,-0x7ff5ea1f,pcVar8);
            }
          }
        }
      }
    }
  }
  this_00 = callInfo_local;
  pcVar8 = (char16 *)(**(code **)(*(long *)callInfo_local + 0x328))(callInfo_local);
  bVar3 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (normalizationForm,pcVar8,*(int32 *)((long)this_00 + 0x18));
  if (!bVar3) {
    tempAllocator = ScriptContext::GetTemporaryAllocator(pSVar1,L"normalize");
    local_54 = 0;
    pcVar8 = GetNormalizedString((JavascriptString *)this_00,normalizationForm,
                                 &tempAllocator->allocator,&local_54);
    if (pcVar8 == (char16 *)0x0) {
      if (local_54 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0x603,"(sizeEstimate == 0)","sizeEstimate == 0");
        if (!bVar3) {
LAB_00bbde52:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      this_00 = (CallInfo)
                JavascriptLibrary::GetEmptyString
                          ((pSVar1->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      this_00 = (CallInfo)NewWithBufferT<Js::LiteralString,true>(pcVar8,local_54,pSVar1);
    }
    ScriptContext::ReleaseTemporaryAllocator(pSVar1,tempAllocator);
  }
  return (Var)this_00;
}

Assistant:

Var JavascriptString::EntryNormalize(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString *pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.normalize"), &pThis);

        UnicodeText::NormalizationForm form = UnicodeText::NormalizationForm::C;

        if (args.Info.Count >= 2 && !(JavascriptOperators::IsUndefinedObject(args.Values[1])))
        {
            JavascriptString *formStr = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
            if (!formStr)
            {
                formStr = JavascriptConversion::ToString(args[1], scriptContext);
            }

            if (formStr->BufferEquals(_u("NFD"), 3))
            {
                form = UnicodeText::NormalizationForm::D;
            }
            else if (formStr->BufferEquals(_u("NFKC"), 4))
            {
                form = UnicodeText::NormalizationForm::KC;
            }
            else if (formStr->BufferEquals(_u("NFKD"), 4))
            {
                form = UnicodeText::NormalizationForm::KD;
            }
            else if (!formStr->BufferEquals(_u("NFC"), 3))
            {
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidNormalizationForm, formStr->GetString());
            }
        }

        if (UnicodeText::IsNormalizedString(form, pThis->GetSz(), pThis->GetLength()))
        {
            return pThis;
        }

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("normalize"));

        charcount_t sizeEstimate = 0;
        char16* buffer = pThis->GetNormalizedString(form, tempAllocator, sizeEstimate);
        JavascriptString * retVal;
        if (buffer == nullptr)
        {
            Assert(sizeEstimate == 0);
            retVal = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            retVal = JavascriptString::NewCopyBuffer(buffer, sizeEstimate, scriptContext);
        }

        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        return retVal;
    }